

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.c
# Opt level: O0

void * stack_push_internal(AbstractStack *s,void *elem)

{
  int iVar1;
  void **ppvVar2;
  int n;
  void *elem_local;
  AbstractStack *s_local;
  
  iVar1 = (int)((long)s->cur - (long)s->start >> 3);
  if (s->start == s->initial) {
    ppvVar2 = (void **)malloc((long)(iVar1 << 1) << 3);
    s->cur = ppvVar2;
    memcpy(s->cur,s->start,(long)iVar1 << 3);
  }
  else {
    ppvVar2 = (void **)realloc(s->start,(long)(iVar1 << 1) << 3);
    s->cur = ppvVar2;
  }
  s->start = s->cur;
  s->end = s->cur;
  s->cur = s->cur + iVar1;
  s->end = s->end + (iVar1 << 1);
  ppvVar2 = s->cur;
  s->cur = ppvVar2 + 1;
  *ppvVar2 = elem;
  return elem;
}

Assistant:

void *stack_push_internal(AbstractStack *s, void *elem) {
  int n = s->cur - s->start;
  if (s->start == s->initial) {
    s->cur = (void **)MALLOC(n * 2 * sizeof(void *));
    memcpy(s->cur, s->start, n * sizeof(void *));
  } else
    s->cur = (void **)REALLOC(s->start, n * 2 * sizeof(void *));
  s->end = s->start = s->cur;
  s->cur += n;
  s->end += n * 2;
  *s->cur++ = elem;
  return elem;
}